

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

long unpaid_cost(obj *unp_obj)

{
  monst *shkp;
  bill_x *pbVar1;
  long lVar2;
  
  for (shkp = next_shkp(level->monlist,'\x01'); shkp != (monst *)0x0;
      shkp = next_shkp(shkp->nmon,'\x01')) {
    pbVar1 = onbill(unp_obj,shkp,'\x01');
    if (pbVar1 != (bill_x *)0x0) goto LAB_0023d40c;
  }
  pbVar1 = (bill_x *)0x0;
LAB_0023d40c:
  if (pbVar1 == (bill_x *)0x0) {
    lVar2 = 0;
    warning("unpaid_cost: object wasn\'t on any bill!");
  }
  else {
    lVar2 = (long)pbVar1->price * (long)unp_obj->quan;
  }
  return lVar2;
}

Assistant:

long unpaid_cost(const struct obj *unp_obj)
{
	struct bill_x *bp = NULL;
	struct monst *shkp;

	for (shkp = next_shkp(level->monlist, TRUE); shkp;
					shkp = next_shkp(shkp->nmon, TRUE))
	    if ((bp = onbill(unp_obj, shkp, TRUE)) != 0) break;

	/* onbill() gave no message if unexpected problem occurred */
	if (!bp) warning("unpaid_cost: object wasn't on any bill!");

	return bp ? unp_obj->quan * bp->price : 0L;
}